

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.cpp
# Opt level: O1

void __thiscall
QDeadlineTimer::setRemainingTime(QDeadlineTimer *this,qint64 msecs,TimerType timerType)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (msecs < 0) {
    this->t1 = 0x7fffffffffffffff;
    this->t2 = 0;
    this->type = timerType;
  }
  else {
    if (msecs == 0) {
      this->t2 = 0;
      this->type = timerType;
      lVar3 = -0x8000000000000000;
    }
    else {
      lVar1 = std::chrono::_V2::steady_clock::now();
      this->t1 = lVar1;
      this->t2 = (int)((ulong)timerType << 0x20);
      this->type = (int)(((ulong)timerType << 0x20) >> 0x20);
      lVar2 = msecs * 1000000;
      lVar3 = 0x7fffffffffffffff;
      if ((SEXT816(lVar2) == SEXT816(msecs) * SEXT416(1000000)) && (!SCARRY8(lVar1,lVar2))) {
        lVar3 = lVar1 + lVar2;
      }
    }
    this->t1 = lVar3;
  }
  return;
}

Assistant:

void QDeadlineTimer::setRemainingTime(qint64 msecs, Qt::TimerType timerType) noexcept
{
    if (msecs < 0) {
        *this = QDeadlineTimer(Forever, timerType);
    } else if (msecs == 0) {
        *this = QDeadlineTimer(timerType);
        t1 = std::numeric_limits<qint64>::min();
    } else {
        *this = current(timerType);
        milliseconds ms(msecs);
        t1 = add_saturate(t1, ms);
    }
}